

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O1

void __thiscall
std::pair<toml::string,_toml::detail::region>::pair
          (pair<toml::string,_toml::detail::region> *this,
          pair<toml::string,_toml::detail::region> *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->first).kind = (param_1->first).kind;
  paVar1 = &(this->first).str.field_2;
  (this->first).str._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->first).str._M_dataplus._M_p;
  paVar2 = &(param_1->first).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->first).str.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->first).str.field_2 + 8) = uVar4;
  }
  else {
    (this->first).str._M_dataplus._M_p = pcVar3;
    (this->first).str.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->first).str._M_string_length = (param_1->first).str._M_string_length;
  (param_1->first).str._M_dataplus._M_p = (pointer)paVar2;
  (param_1->first).str._M_string_length = 0;
  (param_1->first).str.field_2._M_local_buf[0] = '\0';
  toml::detail::region::region(&this->second,&param_1->second);
  return;
}

Assistant:

string(string&& s)      = default;